

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstExpr.cpp
# Opt level: O2

void TestConstExpr::ComparisonTestTU<long,short>(void)

{
  int iVar1;
  
  if (ComparisonTestTU<long,short>()::b1 == '\0') {
    iVar1 = __cxa_guard_acquire(&ComparisonTestTU<long,short>()::b1);
    if (iVar1 != 0) {
      ComparisonTestTU<long,_short>::b1 = LessThanTest<long,short>();
      __cxa_guard_release(&ComparisonTestTU<long,short>()::b1);
    }
  }
  if (ComparisonTestTU<long,short>()::b2 == '\0') {
    iVar1 = __cxa_guard_acquire(&ComparisonTestTU<long,short>()::b2);
    if (iVar1 != 0) {
      ComparisonTestTU<long,_short>::b2 = LessThanEqualTest<long,short>();
      __cxa_guard_release(&ComparisonTestTU<long,short>()::b2);
    }
  }
  if (ComparisonTestTU<long,short>()::b3 == '\0') {
    iVar1 = __cxa_guard_acquire(&ComparisonTestTU<long,short>()::b3);
    if (iVar1 != 0) {
      ComparisonTestTU<long,_short>::b3 = false;
      __cxa_guard_release(&ComparisonTestTU<long,short>()::b3);
    }
  }
  if (ComparisonTestTU<long,short>()::b4 == '\0') {
    iVar1 = __cxa_guard_acquire(&ComparisonTestTU<long,short>()::b4);
    if (iVar1 != 0) {
      ComparisonTestTU<long,_short>::b4 = false;
      __cxa_guard_release(&ComparisonTestTU<long,short>()::b4);
    }
  }
  if (ComparisonTestTU<long,short>()::b5 == '\0') {
    iVar1 = __cxa_guard_acquire(&ComparisonTestTU<long,short>()::b5);
    if (iVar1 != 0) {
      ComparisonTestTU<long,_short>::b5 = false;
      __cxa_guard_release(&ComparisonTestTU<long,short>()::b5);
    }
  }
  if (ComparisonTestTU<long,short>()::b6 == '\0') {
    iVar1 = __cxa_guard_acquire(&ComparisonTestTU<long,short>()::b6);
    if (iVar1 != 0) {
      ComparisonTestTU<long,_short>::b6 = NotEqualTest<long,short>();
      __cxa_guard_release(&ComparisonTestTU<long,short>()::b6);
      return;
    }
  }
  return;
}

Assistant:

void ComparisonTestTU()
	{
		static bool b1 = LessThanTest<T, U>();
		static bool b2 = LessThanEqualTest<T, U>();
		static bool b3 = GreaterThanTest<T, U>();
		static bool b4 = GreaterThanEqualTest<T, U>();
		static bool b5 = EqualTest<T, U>();
		static bool b6 = NotEqualTest<T, U>();
	}